

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

void __thiscall HighsSymmetries::clear(HighsSymmetries *this)

{
  pointer piVar1;
  
  piVar1 = (this->permutationColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->permutationColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->permutationColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  piVar1 = (this->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  piVar1 = (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  piVar1 = (this->orbitSize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->orbitSize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->orbitSize).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  piVar1 = (this->columnPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->columnPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->columnPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  piVar1 = (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  HighsHashTable<int,_int>::clear(&this->columnToOrbitope);
  std::vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>::_M_erase_at_end
            (&this->orbitopes,
             (this->orbitopes).
             super__Vector_base<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>._M_impl.
             super__Vector_impl_data._M_start);
  this->numPerms = 0;
  this->numGenerators = 0;
  return;
}

Assistant:

void HighsSymmetries::clear() {
  permutationColumns.clear();
  permutations.clear();
  orbitPartition.clear();
  orbitSize.clear();
  columnPosition.clear();
  linkCompressionStack.clear();
  columnToOrbitope.clear();
  orbitopes.clear();
  numPerms = 0;
  numGenerators = 0;
}